

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionLhs<const_std::shared_ptr<spdlog::logger>_&>::endExpression
          (ExpressionLhs<const_std::shared_ptr<spdlog::logger>_&> *this)

{
  ResultBuilder *pRVar1;
  bool value_00;
  string local_38;
  byte local_11;
  ExpressionLhs<const_std::shared_ptr<spdlog::logger>_&> *pEStack_10;
  bool value;
  ExpressionLhs<const_std::shared_ptr<spdlog::logger>_&> *this_local;
  
  pEStack_10 = this;
  local_11 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this->m_lhs);
  pRVar1 = this->m_rb;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)local_11,value_00);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  pRVar1 = ResultBuilder::setResultType(pRVar1,(bool)(local_11 & 1));
  ResultBuilder::endExpression(pRVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }